

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbMfs.c
# Opt level: O3

Vec_Wec_t * Acb_DeriveCnfForWindow(Acb_Ntk_t *p,Vec_Int_t *vWin,int PivotVar)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  
  if ((p->vCnfs).nSize != (p->vObjType).nSize) {
    __assert_fail("Vec_WecSize(vCnfs) == Acb_NtkObjNumMax(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbMfs.c"
                  ,0x6c,"Vec_Wec_t *Acb_DeriveCnfForWindow(Acb_Ntk_t *, Vec_Int_t *, int)");
  }
  iVar1 = vWin->nSize;
  if (0 < iVar1) {
    lVar3 = 0;
    do {
      uVar2 = vWin->pArray[lVar3];
      if ((int)uVar2 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x130,"int Abc_LitIsCompl(int)");
      }
      if ((PivotVar <= lVar3) || ((uVar2 & 1) == 0)) {
        if (uVar2 < 2) {
          __assert_fail("i>0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                        ,0x118,"Vec_Str_t *Acb_ObjCnfs(Acb_Ntk_t *, int)");
        }
        uVar2 = uVar2 >> 1;
        if ((p->vCnfs).nSize <= (int)uVar2) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                        ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
        }
        if ((p->vCnfs).pArray[uVar2].nSize < 1) {
          Acb_DeriveCnfForWindowOne(p,uVar2);
          iVar1 = vWin->nSize;
        }
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < iVar1);
  }
  return &p->vCnfs;
}

Assistant:

Vec_Wec_t * Acb_DeriveCnfForWindow( Acb_Ntk_t * p, Vec_Int_t * vWin, int PivotVar )
{
    Vec_Wec_t * vCnfs = &p->vCnfs;
    Vec_Str_t * vCnfBase; int i, iObj;
    assert( Vec_WecSize(vCnfs) == Acb_NtkObjNumMax(p) );
    Vec_IntForEachEntry( vWin, iObj, i )
    {
        if ( Abc_LitIsCompl(iObj) && i < PivotVar )
            continue;
        iObj = Abc_Lit2Var(iObj);
        vCnfBase = Acb_ObjCnfs( p, iObj );
        if ( Vec_StrSize(vCnfBase) > 0 )
            continue;
        Acb_DeriveCnfForWindowOne( p, iObj );
    }
    return vCnfs;
}